

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O0

_Bool should_do_dry_run_encode_for_current_block
                (BLOCK_SIZE sb_size,BLOCK_SIZE max_partition_size,int curr_block_index,
                BLOCK_SIZE bsize)

{
  BLOCK_SIZE BVar1;
  BLOCK_SIZE in_CL;
  int in_EDX;
  BLOCK_SIZE in_SIL;
  BLOCK_SIZE sub_sb_size;
  PARTITION_TYPE in_stack_fffffffffffffff5;
  BLOCK_SIZE in_stack_fffffffffffffff6;
  _Bool local_1;
  
  if (in_SIL < in_CL) {
    local_1 = false;
  }
  else if (in_EDX == 3) {
    BVar1 = get_partition_subsize(in_stack_fffffffffffffff6,in_stack_fffffffffffffff5);
    local_1 = in_CL == in_SIL && BVar1 != in_SIL;
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

static inline bool should_do_dry_run_encode_for_current_block(
    BLOCK_SIZE sb_size, BLOCK_SIZE max_partition_size, int curr_block_index,
    BLOCK_SIZE bsize) {
  if (bsize > max_partition_size) return false;

  // Enable the reconstruction with dry-run for the 4th sub-block only if its
  // parent block's reconstruction with dry-run is skipped. If
  // max_partition_size is the same as immediate split of superblock, then avoid
  // reconstruction of the 4th sub-block, as this data is not consumed.
  if (curr_block_index != 3) return true;

  const BLOCK_SIZE sub_sb_size =
      get_partition_subsize(sb_size, PARTITION_SPLIT);
  return bsize == max_partition_size && sub_sb_size != max_partition_size;
}